

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O1

int main(int argc,char **argv)

{
  vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *pvVar1;
  RNNPointer *pRVar2;
  uint uVar3;
  mapped_type mVar4;
  pointer pcVar5;
  pointer pfVar6;
  pointer pcVar7;
  pointer puVar8;
  undefined8 uVar9;
  size_type sVar10;
  char cVar11;
  __pid_t _Var12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  ostream *poVar17;
  size_t sVar18;
  const_iterator cVar19;
  any *paVar20;
  uint *puVar21;
  double *pdVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  mapped_type *pmVar24;
  mapped_type *pmVar25;
  mapped_type *pmVar26;
  istream *piVar27;
  _Base_ptr p_Var28;
  _Rb_tree_node_base *p_Var29;
  long *plVar30;
  mapped_type *pmVar31;
  size_type sVar32;
  mapped_type *pmVar33;
  mapped_type *pmVar34;
  Tensor *t;
  long lVar35;
  mapped_type *sentenceUnkStrings;
  pointer puVar36;
  long *plVar37;
  long lVar38;
  uint *w_1;
  key_type_conflict *pkVar39;
  ulong uVar40;
  long lVar41;
  char *pcVar42;
  uint *w_2;
  uint *w;
  pointer ppNVar43;
  _Alloc_hider __x;
  uint uVar44;
  uint uVar45;
  bool bVar46;
  bool bVar47;
  float fVar48;
  real rVar49;
  double dVar50;
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double local_ce0;
  double local_cd8;
  double local_cd0;
  double local_cc8;
  uint kUNK;
  int local_cb8;
  uint local_cb4;
  double right;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  int argc_local;
  ulong local_c80;
  vector<float,_std::allocator<float>_> v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pred;
  string line;
  undefined8 local_bd0;
  basic_text_oprimitive<std::ostream> local_bc8 [88];
  vector<unsigned_int,_std::allocator<unsigned_int>_> tsentence_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> hyp;
  ulong local_af8;
  double right_1;
  char **argv_local;
  long *local_ad8;
  long local_ad0;
  long local_ac8;
  long lStack_ac0;
  double local_ab8;
  double dStack_ab0;
  undefined1 *local_aa8 [2];
  undefined1 local_a98 [16];
  long *local_a88;
  long local_a80;
  long local_a78;
  long lStack_a70;
  string fname;
  variables_map conf;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_a08 [8];
  _Rb_tree_node_base local_a00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9d8 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9a8;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> training_vocab;
  string local_948;
  string local_928;
  Model model;
  istringstream lin;
  int iStack_8ac;
  undefined1 local_8a8 [112];
  ios_base local_838 [128];
  ios_base local_7b8 [272];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> singletons;
  ParserBuilder parser;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  ostringstream os;
  ios_base local_138 [264];
  
  argc_local = argc;
  argv_local = argv;
  cnn::Initialize(&argc_local,&argv_local,0,false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"COMMAND:",8);
  if (argc_local != 0) {
    uVar40 = 0;
    do {
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x20);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)&parser,1);
      pcVar42 = argv_local[uVar40];
      if (pcVar42 == (char *)0x0) {
        std::ios::clear((int)poVar17 + (int)*(undefined8 *)(*(long *)poVar17 + -0x18));
      }
      else {
        sVar18 = strlen(pcVar42);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar42,sVar18);
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 < (uint)argc_local);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  boost::program_options::variables_map::variables_map(&conf);
  InitCommandLine(argc_local,argv_local,&conf);
  pvVar1 = &parser.stack_lstm.super_RNNBuilder.head;
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"use_pos_tags","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_a08,(key_type *)&parser);
  USE_POS = cVar19._M_node != &local_a00;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"use_spelling","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_a08,(key_type *)&parser);
  USE_SPELLING = cVar19._M_node != &local_a00;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  corpus.USE_SPELLING = USE_SPELLING;
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"layers","");
  paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar21 = boost::any_cast<unsigned_int_const&>(paVar20);
  LAYERS = *puVar21;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"input_dim","");
  paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar21 = boost::any_cast<unsigned_int_const&>(paVar20);
  INPUT_DIM = *puVar21;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"pretrained_dim","");
  paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar21 = boost::any_cast<unsigned_int_const&>(paVar20);
  PRETRAINED_DIM = *puVar21;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"hidden_dim","");
  paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar21 = boost::any_cast<unsigned_int_const&>(paVar20);
  HIDDEN_DIM = *puVar21;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"action_dim","");
  paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar21 = boost::any_cast<unsigned_int_const&>(paVar20);
  ACTION_DIM = *puVar21;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"lstm_input_dim","");
  paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar21 = boost::any_cast<unsigned_int_const&>(paVar20);
  LSTM_INPUT_DIM = *puVar21;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"pos_dim","");
  paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar21 = boost::any_cast<unsigned_int_const&>(paVar20);
  POS_DIM = *puVar21;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"rel_dim","");
  paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar21 = boost::any_cast<unsigned_int_const&>(paVar20);
  REL_DIM = *puVar21;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"beam_size","");
  paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar21 = boost::any_cast<unsigned_int_const&>(paVar20);
  uVar3 = *puVar21;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"unk_strategy","");
  paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar21 = boost::any_cast<unsigned_int_const&>(paVar20);
  uVar45 = *puVar21;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Unknown word strategy: ",0x17);
  if (uVar45 != 1) {
    abort();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"STOCHASTIC REPLACEMENT\n",0x17);
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"unk_prob","");
  paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  pdVar22 = boost::any_cast<double_const&>(paVar20);
  dVar51 = *pdVar22;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  if (dVar51 < 0.0) {
    pcVar42 = "unk_prob >= 0.";
  }
  else {
    if (dVar51 <= 1.0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&os,"parser_",7);
      pcVar42 = "nopos";
      if (USE_POS != 0) {
        pcVar42 = "pos";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&os,pcVar42,(ulong)(USE_POS ^ 1) * 2 + 3);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&os,(char *)&parser,1)
      ;
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)&parser,1);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)&parser,1);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)&parser,1);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)&parser,1);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)&parser,1);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)&parser,1);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"-pid",4);
      _Var12 = getpid();
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,_Var12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,".params",7);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Writing parameters to file: ",0x1c);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,fname._M_dataplus._M_p,fname._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"training_data","");
      paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
      pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar20);
      pcVar5 = (pbVar23->_M_dataplus)._M_p;
      local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_928,pcVar5,pcVar5 + pbVar23->_M_string_length);
      cpyp::Corpus::load_correct_actions(&corpus,&local_928);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_928._M_dataplus._M_p != &local_928.field_2) {
        operator_delete(local_928._M_dataplus._M_p);
      }
      if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
          parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
        operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
      }
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"UNK","");
      pmVar24 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[](&corpus.wordsToInt,(key_type *)&parser);
      if (*pmVar24 == 0) {
        *pmVar24 = corpus.max;
        corpus.max = corpus.max + 1;
        pmVar25 = std::
                  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&corpus.intToWords,pmVar24);
        std::__cxx11::string::_M_assign((string *)pmVar25);
        corpus.nwords = corpus.max;
      }
      mVar4 = *pmVar24;
      if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
          parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
        operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
      }
      kUNK = mVar4;
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"ROOT","");
      pmVar24 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[](&corpus.wordsToInt,(key_type *)&parser);
      if (*pmVar24 == 0) {
        *pmVar24 = corpus.max;
        corpus.max = corpus.max + 1;
        pmVar25 = std::
                  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&corpus.intToWords,pmVar24);
        std::__cxx11::string::_M_assign((string *)pmVar25);
        corpus.nwords = corpus.max;
      }
      kROOT_SYMBOL = *pmVar24;
      if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
          parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
        operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
      }
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"words","");
      cVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_a08,(key_type *)&parser);
      if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
          parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
        operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
      }
      if (cVar19._M_node != &local_a00) {
        _lin = _lin & 0xffffffff00000000;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&parser,(ulong)PRETRAINED_DIM,
                   (value_type_conflict2 *)&lin,(allocator_type *)&line);
        pmVar26 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pretrained,&kUNK);
        pfVar6 = (pmVar26->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        (pmVar26->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_start = (pointer)parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder;
        (pmVar26->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)parser.stack_lstm.super_RNNBuilder._8_8_;
        (pmVar26->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_end_of_storage =
             (pointer)parser.stack_lstm.super_RNNBuilder.head.
                      super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
                      super__Vector_impl_data._M_start;
        parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)0x0;
        parser.stack_lstm.super_RNNBuilder.cur.t = 0;
        parser.stack_lstm.super_RNNBuilder.sm.q_ = CREATED;
        parser.stack_lstm.super_RNNBuilder.head.
        super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        if (pfVar6 != (pointer)0x0) {
          operator_delete(pfVar6);
        }
        if (parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != (_func_int **)0x0) {
          operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Loading from ",0xd);
        parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"words","");
        paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf)
        ;
        pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar20);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(pbVar23->_M_dataplus)._M_p,
                             pbVar23->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," with",5);
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," dimensions\n",0xc);
        if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
            parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
          operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
        }
        _lin = local_8a8 + 8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&lin,"words","");
        paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf)
        ;
        pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar20);
        std::ifstream::ifstream(&parser,(pbVar23->_M_dataplus)._M_p,_S_in);
        if (_lin != local_8a8 + 8) {
          operator_delete(_lin);
        }
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_allocated_capacity = line.field_2._M_allocated_capacity & 0xffffffffffffff00
        ;
        cVar11 = std::ios::widen((char)&parser +
                                 (char)parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder[-3]);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&parser,(string *)&line,cVar11);
        _lin = _lin & 0xffffffff00000000;
        std::vector<float,_std::allocator<float>_>::vector
                  (&v,(ulong)PRETRAINED_DIM,(value_type_conflict2 *)&lin,(allocator_type *)&model);
        model.all_params.
        super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&model.all_params.
                       super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        model.all_params.
        super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        model.all_params.
        super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)model.all_params.
                              super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        while( true ) {
          cVar11 = std::ios::widen((char)parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder[-3] +
                                   (char)&parser);
          piVar27 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&parser,(string *)&line,cVar11);
          if (((byte)piVar27[*(long *)(*(long *)piVar27 + -0x18) + 0x20] & 5) != 0) break;
          std::__cxx11::istringstream::istringstream((istringstream *)&lin,(string *)&line,_S_in);
          std::operator>>((istream *)&lin,(string *)&model);
          if (PRETRAINED_DIM != 0) {
            uVar40 = 0;
            do {
              std::istream::_M_extract<float>((float *)&lin);
              uVar40 = uVar40 + 1;
            } while (uVar40 < PRETRAINED_DIM);
          }
          pmVar24 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[](&corpus.wordsToInt,(key_type *)&model);
          if (*pmVar24 == 0) {
            *pmVar24 = corpus.max;
            corpus.max = corpus.max + 1;
            pmVar25 = std::
                      map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&corpus.intToWords,pmVar24);
            std::__cxx11::string::_M_assign((string *)pmVar25);
            corpus.nwords = corpus.max;
          }
          training_vocab._M_t._M_impl._0_4_ = *pmVar24;
          pmVar26 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&pretrained,(key_type *)&training_vocab);
          std::vector<float,_std::allocator<float>_>::operator=(pmVar26,&v);
          std::__cxx11::istringstream::~istringstream((istringstream *)&lin);
          std::ios_base::~ios_base(local_838);
        }
        if (model.all_params.
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&model.all_params.
                      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(model.all_params.
                          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p);
        }
        std::ifstream::~ifstream(&parser);
      }
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &training_vocab._M_t._M_impl.super__Rb_tree_header._M_header;
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &singletons._M_t._M_impl.super__Rb_tree_header._M_header;
      singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      parser.stack_lstm.super_RNNBuilder.head.
      super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
      super__Vector_impl_data._M_finish = &parser.stack_lstm.super_RNNBuilder.cur;
      parser.stack_lstm.super_RNNBuilder._8_8_ =
           parser.stack_lstm.super_RNNBuilder._8_8_ & 0xffffffff00000000;
      parser.stack_lstm.super_RNNBuilder.head.
      super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      parser.stack_lstm.params.
      super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      parser.stack_lstm.super_RNNBuilder.head.
      super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           parser.stack_lstm.super_RNNBuilder.head.
           super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if ((_Rb_tree_header *)corpus.sentences._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          != &corpus.sentences._M_t._M_impl.super__Rb_tree_header) {
        p_Var28 = corpus.sentences._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          _lin = p_Var28[1]._M_color;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_8a8,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var28[1]._M_parent);
          uVar9 = local_8a8._8_8_;
          for (ppNVar43 = (pointer)local_8a8._0_8_; ppNVar43 != (pointer)uVar9;
              ppNVar43 = (pointer)((long)ppNVar43 + 4)) {
            line._M_dataplus._M_p._0_4_ = *(uint *)ppNVar43;
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&training_vocab,(uint *)&line);
            pmVar24 = std::
                      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    *)&parser,(key_type_conflict *)&line);
            *pmVar24 = *pmVar24 + 1;
          }
          if ((pointer)local_8a8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_8a8._0_8_);
          }
          p_Var28 = (_Base_ptr)std::_Rb_tree_increment(p_Var28);
        } while ((_Rb_tree_header *)p_Var28 != &corpus.sentences._M_t._M_impl.super__Rb_tree_header)
        ;
      }
      pRVar2 = &parser.stack_lstm.super_RNNBuilder.cur;
      if (parser.stack_lstm.super_RNNBuilder.head.
          super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
          super__Vector_impl_data._M_finish != pRVar2) {
        p_Var29 = (_Rb_tree_node_base *)
                  parser.stack_lstm.super_RNNBuilder.head.
                  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          pcVar5 = *(pointer *)(p_Var29 + 1);
          iStack_8ac = (int)((ulong)pcVar5 >> 0x20);
          bVar46 = iStack_8ac == 1;
          _lin = pcVar5;
          if (bVar46) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&singletons,(uint *)&lin);
          }
          p_Var29 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var29);
        } while (p_Var29 != (_Rb_tree_node_base *)pRVar2);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&parser);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Number of words: ",0x11);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      VOCAB_SIZE = corpus.nwords + 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Number of UTF8 chars: ",0x16);
      plVar30 = (long *)std::ostream::operator<<(&std::cerr,corpus.maxChars);
      std::ios::widen((char)*(undefined8 *)(*plVar30 + -0x18) + (char)plVar30);
      std::ostream::put((char)plVar30);
      std::ostream::flush();
      if (0xff < corpus.maxChars) {
        CHAR_SIZE = corpus.maxChars;
      }
      ACTION_SIZE = corpus.nactions + 1;
      POS_SIZE = corpus.npos + 10;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&possible_actions,(ulong)corpus.nactions);
      puVar36 = possible_actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (corpus.nactions != 0) {
        uVar40 = 0;
        do {
          puVar36[uVar40] = (uint)uVar40;
          uVar40 = uVar40 + 1;
        } while (uVar40 < corpus.nactions);
      }
      model.lookup_params.
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.gradient_norm_scratch = (float *)0x0;
      model.lookup_params.
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.lookup_params.
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ParserBuilder::ParserBuilder(&parser,&model,&pretrained);
      pcVar5 = local_8a8 + 8;
      _lin = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&lin,"model","");
      cVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_a08,(key_type *)&lin);
      if (_lin != pcVar5) {
        operator_delete(_lin);
      }
      if (cVar19._M_node != &local_a00) {
        line._M_dataplus._M_p = (pointer)&line.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&line,"model","");
        paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf)
        ;
        pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar20);
        std::ifstream::ifstream(&lin,(pbVar23->_M_dataplus)._M_p,_S_in);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p);
        }
        boost::archive::text_iarchive::text_iarchive((text_iarchive *)&line,(istream *)&lin,0);
        boost::serialization::
        singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Model>_>::
        get_instance();
        boost::archive::detail::basic_iarchive::load_object(&line,(basic_iserializer *)&model);
        boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&line);
        boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
                  ((basic_text_iprimitive<std::istream> *)&local_bd0);
        std::ifstream::~ifstream(&lin);
      }
      _lin = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&lin,"dev_data","");
      paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
      pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar20);
      pcVar7 = (pbVar23->_M_dataplus)._M_p;
      local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_948,pcVar7,pcVar7 + pbVar23->_M_string_length);
      cpyp::Corpus::load_correct_actionsDev(&corpus,&local_948);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948._M_dataplus._M_p != &local_948.field_2) {
        operator_delete(local_948._M_dataplus._M_p);
      }
      if (_lin != pcVar5) {
        operator_delete(_lin);
      }
      if (USE_SPELLING == true) {
        VOCAB_SIZE = corpus.nwords + 1;
      }
      _lin = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&lin,"train","");
      cVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_a08,(key_type *)&lin);
      if (_lin != pcVar5) {
        operator_delete(_lin);
      }
      if (cVar19._M_node != &local_a00) {
        signal(2,signal_callback_handler);
        v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x3dcccccd3dcccccd;
        v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)&PTR__Trainer_0029c750;
        v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x3da3d70a;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Training started.",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&order,(ulong)corpus.nsentences,(allocator_type *)&lin);
        local_af8 = (ulong)corpus.nsentences;
        if (corpus.nsentences != 0) {
          uVar40 = 0;
          do {
            order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar40] = (uint)uVar40;
            uVar40 = uVar40 + 1;
            local_af8 = (ulong)corpus.nsentences;
          } while (uVar40 < local_af8);
        }
        uVar45 = (uint)local_af8;
        local_cb4 = 100;
        if (uVar45 < 100) {
          local_cb4 = uVar45;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"NUMBER OF TRAINING SENTENCES: ",0x1e);
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        uVar9 = __M_insert<void_const*>;
        pcVar5 = _VTT;
        right = 0.0;
        if (requested_stop == false) {
          local_cb8 = -1;
          local_c80 = CONCAT44(local_c80._4_4_,
                               (int)CONCAT71((int7)((ulong)__M_insert<void_const*> >> 8),1));
          local_cc8 = 0.0;
          iVar15 = 0;
          bVar46 = false;
          do {
            if (uVar45 == 0) {
              local_ce0 = 0.0;
              local_cd8 = 0.0;
            }
            else {
              local_ce0 = 0.0;
              uVar16 = 0;
              uVar44 = 0;
              do {
                uVar14 = (uint)local_af8;
                if (uVar14 == corpus.nsentences) {
                  if ((local_c80 & 1) == 0) {
                    fVar48 = v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_ + 1.0;
                    v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)CONCAT44(fVar48,v.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _0_4_);
                    v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         (pointer)CONCAT44(v.super__Vector_base<float,_std::allocator<float>_>.
                                           _M_impl.super__Vector_impl_data._M_finish._0_4_ /
                                           (fVar48 * v.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _0_4_ + 1.0),
                                           v.super__Vector_base<float,_std::allocator<float>_>.
                                           _M_impl.super__Vector_impl_data._M_finish._0_4_);
                  }
                  else {
                    local_c80 = local_c80 & 0xffffffff00000000;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"**SHUFFLE\n",10);
                  puVar8 = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                  puVar36 = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  uVar14 = 0;
                  if (order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    if (order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + 1 !=
                        order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
                      lVar41 = 4;
                      do {
                        iVar13 = rand();
                        lVar38 = (long)iVar13 % ((lVar41 >> 2) + 1);
                        if (lVar41 != lVar38 * 4) {
                          uVar14 = *(uint *)((long)puVar36 + lVar41);
                          *(uint *)((long)puVar36 + lVar41) = puVar36[lVar38];
                          puVar36[lVar38] = uVar14;
                        }
                        lVar38 = lVar41 + 4;
                        lVar41 = lVar41 + 4;
                      } while ((pointer)((long)puVar36 + lVar38) != puVar8);
                    }
                    uVar14 = 0;
                  }
                }
                local_cc8 = local_cc8 + 1.0;
                _lin = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar14];
                pmVar31 = std::
                          map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                          ::operator[](&corpus.sentences,(key_type *)&lin);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&line,pmVar31);
                sVar10 = line._M_string_length;
                for (__x = line._M_dataplus; __x._M_p != (pointer)sVar10; __x._M_p = __x._M_p + 4) {
                  sVar32 = std::
                           set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           ::count(&singletons,(key_type_conflict *)__x._M_p);
                  if ((sVar32 != 0) && (rVar49 = cnn::rand01(), (double)rVar49 < dVar51)) {
                    *(uint *)__x._M_p = kUNK;
                  }
                }
                _lin = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar14];
                pmVar33 = std::
                          map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                          ::operator[](&corpus.sentencesPos,(key_type *)&lin);
                _lin = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar14];
                pmVar34 = std::
                          map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                          ::operator[](&corpus.correct_act_sent,(key_type *)&lin);
                cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&lin);
                ParserBuilder::log_prob_parser
                          (&local_1c0,&parser,(ComputationGraph *)&lin,pmVar31,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&line,pmVar33,
                           pmVar34,&corpus.actions,&corpus.intToWords,&right);
                if (local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_1c0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                t = cnn::ComputationGraph::incremental_forward((ComputationGraph *)&lin);
                rVar49 = cnn::as_scalar(t);
                if (rVar49 < 0.0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Log prob < 0 on sentence ",0x19);
                  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17,": lp=",5);
                  poVar17 = std::ostream::_M_insert<double>((double)rVar49);
                  std::endl<char,std::char_traits<char>>(poVar17);
                  __assert_fail("lp >= 0.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                                ,0x416,"int main(int, char **)");
                }
                cnn::ComputationGraph::backward((ComputationGraph *)&lin);
                cnn::SimpleSGDTrainer::update((SimpleSGDTrainer *)&v,1.0);
                puVar36 = (pmVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_finish;
                puVar8 = (pmVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&lin);
                if (line._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete(line._M_dataplus._M_p);
                }
                local_ce0 = local_ce0 + (double)rVar49;
                local_af8 = (ulong)(uVar14 + 1);
                uVar16 = uVar16 + (int)((ulong)((long)puVar36 - (long)puVar8) >> 2);
                uVar44 = uVar44 + 1;
              } while (uVar44 != local_cb4);
              local_cd8 = (double)uVar16;
            }
            cnn::Trainer::status((Trainer *)&v);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"update #",8);
            local_cb8 = local_cb8 + 1;
            poVar17 = (ostream *)std::ostream::operator<<(&std::cerr,local_cb8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17," (epoch ",8);
            poVar17 = std::ostream::_M_insert<double>(local_cc8 / (double)corpus.nsentences);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,")\tllh: ",7);
            poVar17 = std::ostream::_M_insert<double>(local_ce0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17," ppl: ",6);
            dVar50 = exp(local_ce0 / local_cd8);
            poVar17 = std::ostream::_M_insert<double>(dVar50);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17," err: ",6);
            poVar17 = std::ostream::_M_insert<double>((local_cd8 - right) / local_cd8);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
            std::ostream::put((char)poVar17);
            std::ostream::flush();
            uVar16 = corpus.nsentencesDev;
            right = 0.0;
            iVar13 = main::logc + 1;
            bVar47 = main::logc == (iVar13 / 0x19) * 0x19;
            main::logc = iVar13;
            if (bVar47) {
              right_1 = 0.0;
              lVar41 = std::chrono::_V2::system_clock::now();
              if (uVar16 == 0) {
                local_cd8 = 0.0;
                local_ce0 = 0.0;
                local_cd0 = 0.0;
              }
              else {
                local_cd0 = 0.0;
                uVar44 = 0;
                local_ce0 = 0.0;
                local_cd8 = 0.0;
                do {
                  _lin = uVar44;
                  pmVar31 = std::
                            map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            ::operator[](&corpus.sentencesDev,(key_type *)&lin);
                  _lin = uVar44;
                  pmVar33 = std::
                            map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            ::operator[](&corpus.sentencesPosDev,(key_type *)&lin);
                  _lin = uVar44;
                  pmVar34 = std::
                            map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            ::operator[](&corpus.correct_act_sentDev,(key_type *)&lin);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                            (&tsentence_1,pmVar31);
                  puVar36 = tsentence_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  pkVar39 = tsentence_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  if (USE_SPELLING == false) {
                    for (; pkVar39 != puVar36; pkVar39 = pkVar39 + 1) {
                      sVar32 = std::
                               set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               ::count(&training_vocab,pkVar39);
                      if (sVar32 == 0) {
                        *pkVar39 = kUNK;
                      }
                    }
                  }
                  cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&lin);
                  line._M_dataplus._M_p = (pointer)0x0;
                  line._M_string_length = 0;
                  line.field_2._M_allocated_capacity = 0;
                  ParserBuilder::log_prob_parser
                            (&pred,&parser,(ComputationGraph *)&lin,pmVar31,&tsentence_1,pmVar33,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&line,
                             &corpus.actions,&corpus.intToWords,&right_1);
                  if (line._M_dataplus._M_p != (pointer)0x0) {
                    operator_delete(line._M_dataplus._M_p);
                  }
                  lVar38 = (long)(pmVar34->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pmVar34->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start;
                  lVar35 = lVar38 >> 2;
                  auVar52._8_4_ = (int)(lVar38 >> 0x22);
                  auVar52._0_8_ = lVar35;
                  auVar52._12_4_ = 0x45300000;
                  ParserBuilder::compute_heads
                            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&line,(uint)((ulong)((long)(pmVar31->
                                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pmVar31->
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2),
                             pmVar34,&corpus.actions,
                             (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)0x0);
                  ParserBuilder::compute_heads
                            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&hyp._M_t,
                             (uint)((ulong)((long)(pmVar31->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(pmVar31->
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 )._M_impl.super__Vector_impl_data._M_start) >> 2),
                             &pred,&corpus.actions,
                             (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)0x0);
                  uVar14 = compute_correct((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&line,(
                                                  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)&hyp._M_t,
                                           (int)((ulong)((long)(pmVar31->
                                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pmVar31->
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2)
                                           - 1);
                  lVar38 = ((long)(pmVar31->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pmVar31->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start >> 2) + -1;
                  auVar53._8_4_ = (int)((ulong)lVar38 >> 0x20);
                  auVar53._0_8_ = lVar38;
                  auVar53._12_4_ = 0x45300000;
                  local_ab8 = (double)CONCAT44(0x43300000,(int)lVar38) - 4503599627370496.0;
                  dStack_ab0 = auVar53._8_8_ - 1.9342813113834067e+25;
                  std::
                  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  ::~_Rb_tree(&hyp._M_t);
                  std::
                  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&line);
                  if (pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(pred.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&lin);
                  if (tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(tsentence_1.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  local_cd8 = local_cd8 +
                              (auVar52._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar35) - 4503599627370496.0);
                  local_ce0 = local_ce0 + (double)uVar14;
                  local_cd0 = local_cd0 + dStack_ab0 + local_ab8;
                  uVar44 = uVar44 + 1;
                } while (uVar44 != uVar16);
              }
              lVar38 = std::chrono::_V2::system_clock::now();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"  **dev (iter=",0xe);
              poVar17 = (ostream *)std::ostream::operator<<(&std::cerr,local_cb8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," epoch=",7);
              poVar17 = std::ostream::_M_insert<double>(local_cc8 / (double)corpus.nsentences);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,")\tllh=",6);
              poVar17 = std::ostream::_M_insert<double>(0.0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," ppl: ",6);
              dVar50 = exp(0.0 / local_cd8);
              poVar17 = std::ostream::_M_insert<double>(dVar50);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," err: ",6);
              poVar17 = std::ostream::_M_insert<double>((local_cd8 - right_1) / local_cd8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," uas: ",6);
              poVar17 = std::ostream::_M_insert<double>(local_ce0 / local_cd0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\t[",2);
              poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," sents in ",10);
              poVar17 = std::ostream::_M_insert<double>((double)(lVar38 - lVar41) / 1000000.0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," ms]",4);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
              std::ostream::put((char)poVar17);
              std::ostream::flush();
              if ((double)iVar15 < local_ce0) {
                std::ofstream::ofstream((ostream *)&lin,(string *)&fname,_S_out);
                boost::archive::text_oarchive::text_oarchive
                          ((text_oarchive *)&line,(ostream *)&lin,0);
                boost::serialization::
                singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_cnn::Model>_>
                ::get_instance();
                boost::archive::detail::basic_oarchive::save_object
                          (&line,(basic_oserializer *)&model);
                if (!bVar46) {
                  hyp._M_t._M_impl._0_8_ =
                       &hyp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&hyp," latest_model","")
                  ;
                  pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)&pred.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&pred,"rm -f ","");
                  plVar30 = (long *)std::__cxx11::string::_M_append
                                              ((char *)&pred,hyp._M_t._M_impl._0_8_);
                  puVar36 = (pointer)(plVar30 + 2);
                  if ((pointer)*plVar30 == puVar36) {
                    tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)puVar36;
                    tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)&tsentence_1.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage;
                  }
                  else {
                    tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)puVar36;
                    tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar30;
                  }
                  tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar30[1];
                  *plVar30 = (long)puVar36;
                  plVar30[1] = 0;
                  *(undefined1 *)(plVar30 + 2) = 0;
                  iVar15 = system((char *)tsentence_1.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  if (iVar15 == 0) {
                    local_aa8[0] = local_a98;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"ln -s ","")
                    ;
                    plVar30 = (long *)std::__cxx11::string::_M_append
                                                ((char *)local_aa8,(ulong)fname._M_dataplus._M_p);
                    plVar37 = plVar30 + 2;
                    if ((long *)*plVar30 == plVar37) {
                      local_ac8 = *plVar37;
                      lStack_ac0 = plVar30[3];
                      local_ad8 = &local_ac8;
                    }
                    else {
                      local_ac8 = *plVar37;
                      local_ad8 = (long *)*plVar30;
                    }
                    local_ad0 = plVar30[1];
                    *plVar30 = (long)plVar37;
                    plVar30[1] = 0;
                    *(undefined1 *)(plVar30 + 2) = 0;
                    plVar30 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_ad8,hyp._M_t._M_impl._0_8_);
                    plVar37 = plVar30 + 2;
                    if ((long *)*plVar30 == plVar37) {
                      local_a78 = *plVar37;
                      lStack_a70 = plVar30[3];
                      local_a88 = &local_a78;
                    }
                    else {
                      local_a78 = *plVar37;
                      local_a88 = (long *)*plVar30;
                    }
                    local_a80 = plVar30[1];
                    *plVar30 = (long)plVar37;
                    plVar30[1] = 0;
                    *(undefined1 *)(plVar30 + 2) = 0;
                    iVar13 = system((char *)local_a88);
                    bVar46 = iVar13 == 0;
                  }
                  else {
                    bVar46 = false;
                  }
                  if (iVar15 == 0) {
                    if (local_a88 != &local_a78) {
                      operator_delete(local_a88);
                    }
                    if (local_ad8 != &local_ac8) {
                      operator_delete(local_ad8);
                    }
                    if (local_aa8[0] != local_a98) {
                      operator_delete(local_aa8[0]);
                    }
                  }
                  if ((pointer *)
                      tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                      &tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(tsentence_1.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((pointer *)
                      pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      &pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(pred.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (bVar46) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Created ",8);
                    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,(char *)hyp._M_t._M_impl._0_8_,
                                         hyp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar17," as a soft link to ",0x13);
                    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar17,fname._M_dataplus._M_p,fname._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar17," for convenience.",0x11);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17)
                    ;
                    std::ostream::put((char)poVar17);
                    std::ostream::flush();
                  }
                  if ((_Base_ptr *)hyp._M_t._M_impl._0_8_ !=
                      &hyp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                    operator_delete((void *)hyp._M_t._M_impl._0_8_);
                  }
                  bVar46 = true;
                }
                iVar15 = (int)local_ce0;
                boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)&line);
                boost::archive::basic_text_oprimitive<std::ostream>::~basic_text_oprimitive
                          (local_bc8);
                _lin = pcVar5;
                *(undefined8 *)(&lin + *(long *)(pcVar5 + -0x18)) = uVar9;
                std::filebuf::~filebuf((filebuf *)local_8a8);
                std::ios_base::~ios_base(local_7b8);
              }
            }
          } while (requested_stop != true);
        }
        if (order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        cnn::Trainer::~Trainer((Trainer *)&v);
      }
      right = 0.0;
      local_c80 = std::chrono::_V2::system_clock::now();
      local_ab8 = (double)(ulong)corpus.nsentencesDev;
      if (local_ab8 == 0.0) {
        local_ce0 = 0.0;
        local_cd8 = 0.0;
        local_cc8 = 0.0;
      }
      else {
        local_cc8 = 0.0;
        local_cd8 = 0.0;
        local_ce0 = 0.0;
        uVar45 = 0;
        do {
          _lin = uVar45;
          pmVar31 = std::
                    map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[](&corpus.sentencesDev,(key_type *)&lin);
          _lin = uVar45;
          pmVar33 = std::
                    map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[](&corpus.sentencesPosDev,(key_type *)&lin);
          _lin = uVar45;
          sentenceUnkStrings =
               std::
               map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&corpus.sentencesStrDev,(key_type *)&lin);
          _lin = uVar45;
          local_cb4 = uVar45;
          pmVar34 = std::
                    map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[](&corpus.correct_act_sentDev,(key_type *)&lin);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&pred,pmVar31);
          puVar36 = pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pkVar39 = pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (USE_SPELLING == false) {
            for (; pkVar39 != puVar36; pkVar39 = pkVar39 + 1) {
              sVar32 = std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       count(&training_vocab,pkVar39);
              if (sVar32 == 0) {
                *pkVar39 = kUNK;
              }
            }
          }
          cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&lin);
          order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (uVar3 != 1) {
            abort();
          }
          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          ParserBuilder::log_prob_parser
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&line,&parser,
                     (ComputationGraph *)&lin,pmVar31,&pred,pmVar33,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&v,&corpus.actions,
                     &corpus.intToWords,&right);
          puVar36 = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)line._M_dataplus._M_p;
          order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)line._M_string_length;
          order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)line.field_2._M_allocated_capacity;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length = 0;
          line.field_2._M_allocated_capacity = 0;
          if (puVar36 != (pointer)0x0) {
            operator_delete(puVar36);
          }
          if (line._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(line._M_dataplus._M_p);
          }
          if (v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            operator_delete(v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          lVar41 = (long)(pmVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start;
          lVar38 = lVar41 >> 2;
          auVar54._8_4_ = (int)(lVar41 >> 0x22);
          auVar54._0_8_ = lVar38;
          auVar54._12_4_ = 0x45300000;
          line._M_string_length = line._M_string_length & 0xffffffff00000000;
          line.field_2._M_allocated_capacity = 0;
          line.field_2._8_8_ = &line._M_string_length;
          local_bd0 = 0;
          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((ulong)v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data._M_finish & 0xffffffff00000000);
          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          ParserBuilder::compute_heads
                    (&hyp,(uint)((ulong)((long)(pmVar31->
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pmVar31->
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              )._M_impl.super__Vector_impl_data._M_start) >> 2),
                     pmVar34,&corpus.actions,
                     (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&line);
          ParserBuilder::compute_heads
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &tsentence_1,
                     (uint)((ulong)((long)(pmVar31->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pmVar31->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 2),&order,
                     &corpus.actions,
                     (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&v);
          output_conll(pmVar31,pmVar33,sentenceUnkStrings,&corpus.intToWords,&corpus.intToPos,
                       (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&tsentence_1,
                       (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&v);
          uVar16 = compute_correct((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&hyp._M_t,
                                   (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&tsentence_1,
                                   (int)((ulong)((long)(pmVar31->
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(pmVar31->
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2)
                                   - 1);
          lVar41 = ((long)(pmVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pmVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_start >> 2) + -1;
          auVar55._8_4_ = (int)((ulong)lVar41 >> 0x20);
          auVar55._0_8_ = lVar41;
          auVar55._12_4_ = 0x45300000;
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)&tsentence_1);
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::~_Rb_tree(&hyp._M_t);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&v);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&line);
          if (order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&lin);
          uVar45 = local_cb4;
          if (pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          local_ce0 = local_ce0 +
                      (auVar54._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar38) - 4503599627370496.0);
          local_cd8 = local_cd8 + (double)uVar16;
          local_cc8 = local_cc8 +
                      (auVar55._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar41) - 4503599627370496.0);
          uVar45 = uVar45 + 1;
        } while (uVar45 != local_ab8._0_4_);
      }
      lVar41 = std::chrono::_V2::system_clock::now();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"TEST llh=",9);
      poVar17 = std::ostream::_M_insert<double>(0.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17," ppl: ",6);
      dVar51 = exp(0.0 / local_ce0);
      poVar17 = std::ostream::_M_insert<double>(dVar51);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17," err: ",6);
      poVar17 = std::ostream::_M_insert<double>((local_ce0 - right) / local_ce0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17," uas: ",6);
      poVar17 = std::ostream::_M_insert<double>(local_cd8 / local_cc8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\t[",2);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17," sents in ",10);
      poVar17 = std::ostream::_M_insert<double>((double)(long)(lVar41 - local_c80) / 1000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17," ms]",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      ParserBuilder::~ParserBuilder(&parser);
      cnn::Model::~Model(&model);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&singletons._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&training_vocab._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fname._M_dataplus._M_p != &fname.field_2) {
        operator_delete(fname._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
      std::ios_base::~ios_base(local_138);
      _conf = &boost::archive::detail::basic_oarchive::typeinfo;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_9a8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(local_9d8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
      ::~_Rb_tree(local_a08);
      return 0;
    }
    pcVar42 = "unk_prob <= 1.";
  }
  __assert_fail(pcVar42,
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                ,0x3a5,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv) {
  cnn::Initialize(argc, argv);

  cerr << "COMMAND:"; 
  for (unsigned i = 0; i < static_cast<unsigned>(argc); ++i) cerr << ' ' << argv[i];
  cerr << endl;
  unsigned status_every_i_iterations = 100;

  po::variables_map conf;
  InitCommandLine(argc, argv, &conf);
  USE_POS = conf.count("use_pos_tags");

  USE_SPELLING=conf.count("use_spelling"); //Miguel
  corpus.USE_SPELLING=USE_SPELLING;

  LAYERS = conf["layers"].as<unsigned>();
  INPUT_DIM = conf["input_dim"].as<unsigned>();
  PRETRAINED_DIM = conf["pretrained_dim"].as<unsigned>();
  HIDDEN_DIM = conf["hidden_dim"].as<unsigned>();
  ACTION_DIM = conf["action_dim"].as<unsigned>();
  LSTM_INPUT_DIM = conf["lstm_input_dim"].as<unsigned>();
  POS_DIM = conf["pos_dim"].as<unsigned>();
  REL_DIM = conf["rel_dim"].as<unsigned>();
  const unsigned beam_size = conf["beam_size"].as<unsigned>();
  const unsigned unk_strategy = conf["unk_strategy"].as<unsigned>();
  cerr << "Unknown word strategy: ";
  if (unk_strategy == 1) {
    cerr << "STOCHASTIC REPLACEMENT\n";
  } else {
    abort();
  }
  const double unk_prob = conf["unk_prob"].as<double>();
  assert(unk_prob >= 0.); assert(unk_prob <= 1.);
  ostringstream os;
  os << "parser_" << (USE_POS ? "pos" : "nopos")
     << '_' << LAYERS
     << '_' << INPUT_DIM
     << '_' << HIDDEN_DIM
     << '_' << ACTION_DIM
     << '_' << LSTM_INPUT_DIM
     << '_' << POS_DIM
     << '_' << REL_DIM
     << "-pid" << getpid() << ".params";
  int best_correct_heads = 0;
  const string fname = os.str();
  cerr << "Writing parameters to file: " << fname << endl;
  bool softlinkCreated = false;
  corpus.load_correct_actions(conf["training_data"].as<string>());	
  const unsigned kUNK = corpus.get_or_add_word(cpyp::Corpus::UNK);
  kROOT_SYMBOL = corpus.get_or_add_word(ROOT_SYMBOL);

  if (conf.count("words")) {
    pretrained[kUNK] = vector<float>(PRETRAINED_DIM, 0);
    cerr << "Loading from " << conf["words"].as<string>() << " with" << PRETRAINED_DIM << " dimensions\n";
    ifstream in(conf["words"].as<string>().c_str());
    string line;
    getline(in, line);
    vector<float> v(PRETRAINED_DIM, 0);
    string word;
    while (getline(in, line)) {
      istringstream lin(line);
      lin >> word;
      for (unsigned i = 0; i < PRETRAINED_DIM; ++i) lin >> v[i];
      unsigned id = corpus.get_or_add_word(word);
      pretrained[id] = v;
    }
  }

  set<unsigned> training_vocab; // words available in the training corpus
  set<unsigned> singletons;
  {  // compute the singletons in the parser's training data
    map<unsigned, unsigned> counts;
    for (auto sent : corpus.sentences)
      for (auto word : sent.second) { training_vocab.insert(word); counts[word]++; }
    for (auto wc : counts)
      if (wc.second == 1) singletons.insert(wc.first);
  }

  cerr << "Number of words: " << corpus.nwords << endl;
  VOCAB_SIZE = corpus.nwords + 1;

  cerr << "Number of UTF8 chars: " << corpus.maxChars << endl;
  if (corpus.maxChars>255) CHAR_SIZE=corpus.maxChars;

  ACTION_SIZE = corpus.nactions + 1;
  //POS_SIZE = corpus.npos + 1;
  POS_SIZE = corpus.npos + 10;
  possible_actions.resize(corpus.nactions);
  for (unsigned i = 0; i < corpus.nactions; ++i)
    possible_actions[i] = i;

  Model model;
  ParserBuilder parser(&model, pretrained);
  if (conf.count("model")) {
    ifstream in(conf["model"].as<string>().c_str());
    boost::archive::text_iarchive ia(in);
    ia >> model;
  }

  // OOV words will be replaced by UNK tokens
  corpus.load_correct_actionsDev(conf["dev_data"].as<string>());
  if (USE_SPELLING) VOCAB_SIZE = corpus.nwords + 1;
  //TRAINING
  if (conf.count("train")) {
    signal(SIGINT, signal_callback_handler);
    SimpleSGDTrainer sgd(&model);
    //MomentumSGDTrainer sgd(&model);
    sgd.eta_decay = 0.08;
    //sgd.eta_decay = 0.05;
    cerr << "Training started."<<"\n";
    vector<unsigned> order(corpus.nsentences);
    for (unsigned i = 0; i < corpus.nsentences; ++i)
      order[i] = i;
    double tot_seen = 0;
    status_every_i_iterations = min(status_every_i_iterations, corpus.nsentences);
    unsigned si = corpus.nsentences;
    cerr << "NUMBER OF TRAINING SENTENCES: " << corpus.nsentences << endl;
    unsigned trs = 0;
    double right = 0;
    double llh = 0;
    bool first = true;
    int iter = -1;
    while(!requested_stop) {
      ++iter;
      for (unsigned sii = 0; sii < status_every_i_iterations; ++sii) {
           if (si == corpus.nsentences) {
             si = 0;
             if (first) { first = false; } else { sgd.update_epoch(); }
             cerr << "**SHUFFLE\n";
             random_shuffle(order.begin(), order.end());
           }
           tot_seen += 1;
           const vector<unsigned>& sentence=corpus.sentences[order[si]];
           vector<unsigned> tsentence=sentence;
           if (unk_strategy == 1) {
             for (auto& w : tsentence)
               if (singletons.count(w) && cnn::rand01() < unk_prob) w = kUNK;
           }
	   const vector<unsigned>& sentencePos=corpus.sentencesPos[order[si]]; 
	   const vector<unsigned>& actions=corpus.correct_act_sent[order[si]];
           ComputationGraph hg;
           parser.log_prob_parser(&hg,sentence,tsentence,sentencePos,actions,corpus.actions,corpus.intToWords,&right);
           double lp = as_scalar(hg.incremental_forward());
           if (lp < 0) {
             cerr << "Log prob < 0 on sentence " << order[si] << ": lp=" << lp << endl;
             assert(lp >= 0.0);
           }
           hg.backward();
           sgd.update(1.0);
           llh += lp;
           ++si;
           trs += actions.size();
      }
      sgd.status();
      cerr << "update #" << iter << " (epoch " << (tot_seen / corpus.nsentences) << ")\tllh: "<< llh<<" ppl: " << exp(llh / trs) << " err: " << (trs - right) / trs << endl;
      llh = trs = right = 0;

      static int logc = 0;
      ++logc;
      if (logc % 25 == 1) { // report on dev set
        unsigned dev_size = corpus.nsentencesDev;
        // dev_size = 100;
        double llh = 0;
        double trs = 0;
        double right = 0;
        double correct_heads = 0;
        double total_heads = 0;
        auto t_start = std::chrono::high_resolution_clock::now();
        for (unsigned sii = 0; sii < dev_size; ++sii) {
           const vector<unsigned>& sentence=corpus.sentencesDev[sii];
	   const vector<unsigned>& sentencePos=corpus.sentencesPosDev[sii]; 
	   const vector<unsigned>& actions=corpus.correct_act_sentDev[sii];
           vector<unsigned> tsentence=sentence;
	   if (!USE_SPELLING) {
                for (auto& w : tsentence)
                    if (training_vocab.count(w) == 0) w = kUNK;
           }

           ComputationGraph hg;
	   vector<unsigned> pred = parser.log_prob_parser(&hg,sentence,tsentence,sentencePos,vector<unsigned>(),corpus.actions,corpus.intToWords,&right);
	   double lp = 0;
           //vector<unsigned> pred = parser.log_prob_parser_beam(&hg,sentence,sentencePos,corpus.actions,beam_size,&lp);
           llh -= lp;
           trs += actions.size();
           map<int,int> ref = parser.compute_heads(sentence.size(), actions, corpus.actions);
           map<int,int> hyp = parser.compute_heads(sentence.size(), pred, corpus.actions);
           //output_conll(sentence, corpus.intToWords, ref, hyp);
           correct_heads += compute_correct(ref, hyp, sentence.size() - 1);
           total_heads += sentence.size() - 1;
        }
        auto t_end = std::chrono::high_resolution_clock::now();
        cerr << "  **dev (iter=" << iter << " epoch=" << (tot_seen / corpus.nsentences) << ")\tllh=" << llh << " ppl: " << exp(llh / trs) << " err: " << (trs - right) / trs << " uas: " << (correct_heads / total_heads) << "\t[" << dev_size << " sents in " << std::chrono::duration<double, std::milli>(t_end-t_start).count() << " ms]" << endl;
        if (correct_heads > best_correct_heads) {
          best_correct_heads = correct_heads;
          ofstream out(fname);
          boost::archive::text_oarchive oa(out);
          oa << model;
          // Create a soft link to the most recent model in order to make it
          // easier to refer to it in a shell script.
          if (!softlinkCreated) {
            string softlink = " latest_model";
            if (system((string("rm -f ") + softlink).c_str()) == 0 && 
                system((string("ln -s ") + fname + softlink).c_str()) == 0) {
              cerr << "Created " << softlink << " as a soft link to " << fname 
                   << " for convenience." << endl;
            }
            softlinkCreated = true;
          }
        }
      }
    }
  } // should do training?
  if (true) { // do test evaluation
    double llh = 0;
    double trs = 0;
    double right = 0;
    double correct_heads = 0;
    double total_heads = 0;
    auto t_start = std::chrono::high_resolution_clock::now();
    unsigned corpus_size = corpus.nsentencesDev;
    for (unsigned sii = 0; sii < corpus_size; ++sii) {
      const vector<unsigned>& sentence=corpus.sentencesDev[sii];
      const vector<unsigned>& sentencePos=corpus.sentencesPosDev[sii]; 
      const vector<string>& sentenceUnkStr=corpus.sentencesStrDev[sii]; 
      const vector<unsigned>& actions=corpus.correct_act_sentDev[sii];
      vector<unsigned> tsentence=sentence;
      if (!USE_SPELLING) {
        for (auto& w : tsentence)
	  if (training_vocab.count(w) == 0) w = kUNK;
      }
      ComputationGraph cg;
      double lp = 0;
      vector<unsigned> pred;
      if (beam_size == 1)
        pred = parser.log_prob_parser(&cg,sentence,tsentence,sentencePos,vector<unsigned>(),corpus.actions,corpus.intToWords,&right);
      else
        pred = parser.log_prob_parser_beam(&cg,sentence,tsentence,sentencePos,corpus.actions,beam_size,&lp);
      llh -= lp;
      trs += actions.size();
      map<int, string> rel_ref, rel_hyp;
      map<int,int> ref = parser.compute_heads(sentence.size(), actions, corpus.actions, &rel_ref);
      map<int,int> hyp = parser.compute_heads(sentence.size(), pred, corpus.actions, &rel_hyp);
      output_conll(sentence, sentencePos, sentenceUnkStr, corpus.intToWords, corpus.intToPos, hyp, rel_hyp);
      correct_heads += compute_correct(ref, hyp, sentence.size() - 1);
      total_heads += sentence.size() - 1;
    }
    auto t_end = std::chrono::high_resolution_clock::now();
    cerr << "TEST llh=" << llh << " ppl: " << exp(llh / trs) << " err: " << (trs - right) / trs << " uas: " << (correct_heads / total_heads) << "\t[" << corpus_size << " sents in " << std::chrono::duration<double, std::milli>(t_end-t_start).count() << " ms]" << endl;
  }
  for (unsigned i = 0; i < corpus.actions.size(); ++i) {
    //cerr << corpus.actions[i] << '\t' << parser.p_r->values[i].transpose() << endl;
    //cerr << corpus.actions[i] << '\t' << parser.p_p2a->values.col(i).transpose() << endl;
  }
}